

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Statement * __thiscall soul::StructuralParser::parseStatement(StructuralParser *this)

{
  bool bVar1;
  BreakStatement *e;
  ContinueStatement *e_00;
  Expression *pEVar2;
  size_t sVar3;
  pool_ref *this_00;
  Block *this_01;
  VariableDeclaration *s;
  UTF8Reader local_270;
  pool_ref *local_268;
  pool_ref<soul::AST::VariableDeclaration> *v;
  pool_ref<soul::AST::VariableDeclaration> *__end4;
  pool_ref<soul::AST::VariableDeclaration> *__begin4;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL> *__range4;
  anon_class_8_1_55c32bef local_240;
  Context local_238;
  Identifier local_220;
  undefined1 local_218 [8];
  ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL> variablesCreated;
  Context context;
  undefined1 local_160 [8];
  pool_ptr<soul::AST::Expression> type;
  UTF8Reader oldPos;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  Context local_a0;
  char *local_88;
  Context local_80;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  pool_ptr<soul::AST::Function> local_28;
  char *local_20;
  StructuralParser *local_18;
  StructuralParser *this_local;
  
  local_20 = "{";
  local_18 = this;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)"{");
  if (bVar1) {
    pool_ptr<soul::AST::Function>::pool_ptr(&local_28);
    this_local = (StructuralParser *)parseBracedBlock(this,&local_28);
    pool_ptr<soul::AST::Function>::~pool_ptr(&local_28);
  }
  else {
    local_40 = "if";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x573a3e);
    if (bVar1) {
      this_local = (StructuralParser *)parseIf(this);
    }
    else {
      local_48 = "while";
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"while");
      if (bVar1) {
        this_local = (StructuralParser *)parseWhileLoop(this);
      }
      else {
        local_50 = "for";
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x573504);
        if (bVar1) {
          this_local = (StructuralParser *)parseForLoop(this);
        }
        else {
          local_58 = "loop";
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x572700);
          if (bVar1) {
            this_local = (StructuralParser *)parseLoopStatement(this);
          }
          else {
            local_60 = "return";
            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"return");
            if (bVar1) {
              this_local = (StructuralParser *)parseReturn(this);
            }
            else {
              local_68 = "break";
              bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"break");
              if (bVar1) {
                getContext(&local_80,this);
                e = allocate<soul::AST::BreakStatement,soul::AST::Context>(this,&local_80);
                this_local = (StructuralParser *)
                             matchEndOfStatement<soul::AST::BreakStatement>(this,e);
                AST::Context::~Context(&local_80);
              }
              else {
                local_88 = "continue";
                bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"continue")
                ;
                if (bVar1) {
                  getContext(&local_a0,this);
                  e_00 = allocate<soul::AST::ContinueStatement,soul::AST::Context>(this,&local_a0);
                  this_local = (StructuralParser *)
                               matchEndOfStatement<soul::AST::ContinueStatement>(this,e_00);
                  AST::Context::~Context(&local_a0);
                }
                else {
                  local_a8 = "let";
                  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"let");
                  if (bVar1) {
                    this_local = (StructuralParser *)parseLocalLetOrVar(this,true);
                  }
                  else {
                    local_b0 = "var";
                    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"var");
                    if (bVar1) {
                      this_local = (StructuralParser *)parseLocalLetOrVar(this,false);
                    }
                    else {
                      local_b8 = "external";
                      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                              ::matches(&this->super_SOULTokeniser,(TokenType)"external");
                      if (bVar1) {
                        Errors::externalNotAllowedInFunction<>();
                        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])
                                  (this,&stack0xffffffffffffff10);
                        CompileMessage::~CompileMessage((CompileMessage *)&stack0xffffffffffffff10);
                      }
                      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                              ::matchIf<soul::TokenType>
                                        (&this->super_SOULTokeniser,(TokenType)0x54c9e0);
                      if (bVar1) {
                        this_local = (StructuralParser *)getNoop(this);
                      }
                      else {
                        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                ::matchIf<soul::TokenType>
                                          (&this->super_SOULTokeniser,(TokenType)0x54ca4d);
                        if (bVar1) {
                          pEVar2 = parsePreIncDec(this,true);
                          this_local = (StructuralParser *)
                                       matchEndOfStatement<soul::AST::Expression>(this,pEVar2);
                        }
                        else {
                          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                  ::matchIf<soul::TokenType>
                                            (&this->super_SOULTokeniser,(TokenType)"--");
                          if (bVar1) {
                            pEVar2 = parsePreIncDec(this,false);
                            this_local = (StructuralParser *)
                                         matchEndOfStatement<soul::AST::Expression>(this,pEVar2);
                          }
                          else {
                            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                    ::matches(&this->super_SOULTokeniser,(TokenType)0x573c42);
                            if (bVar1) {
                              pEVar2 = parseFactor(this);
                              this_local = (StructuralParser *)
                                           matchEndOfStatement<soul::AST::Expression>(this,pEVar2);
                            }
                            else {
                              bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                                      ::
                                      matchesAny<soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType>
                                                ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                                                  *)this,(TokenType)"$integer32",
                                                 (TokenType)"$integer64",(TokenType)"$float64",
                                                 (TokenType)"$float32",(TokenType)"$string literal",
                                                 (TokenType)0x56f2f2,(TokenType)"$imag32",
                                                 (TokenType)"$imag64");
                              if (bVar1) {
                                this_local = (StructuralParser *)
                                             parseExpressionAsStatement(this,false);
                              }
                              else {
                                Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                ::getCurrentTokeniserPosition
                                          ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                            *)&type);
                                tryParsingType((StructuralParser *)local_160,(ParseTypeContext)this)
                                ;
                                bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)local_160)
                                ;
                                if ((bVar1) &&
                                   (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                            ::matches(&this->super_SOULTokeniser,
                                                      (TokenType)"$identifier"), bVar1)) {
                                  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                          ::matches(&this->super_SOULTokeniser,(TokenType)0x573c42);
                                  if (bVar1) {
                                    Errors::expectedVariableDecl<>();
                                    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])
                                              (this,&context.parentScope);
                                    CompileMessage::~CompileMessage
                                              ((CompileMessage *)&context.parentScope);
                                  }
                                  getContext((Context *)(variablesCreated.space + 7),this);
                                  ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL>
                                  ::ArrayWithPreallocation
                                            ((ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL>
                                              *)local_218);
                                  pEVar2 = pool_ptr<soul::AST::Expression>::operator*
                                                     ((pool_ptr<soul::AST::Expression> *)local_160);
                                  local_220 = parseIdentifier(this);
                                  AST::Context::Context
                                            (&local_238,(Context *)(variablesCreated.space + 7));
                                  local_240.variablesCreated =
                                       (ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL>
                                        *)local_218;
                                  parseVariableDeclaration<soul::StructuralParser::parseStatement()::_lambda(soul::AST::VariableDeclaration&)_1_>
                                            (this,pEVar2,local_220,false,&local_238,&local_240);
                                  AST::Context::~Context(&local_238);
                                  sVar3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL>
                                          ::size((ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL>
                                                  *)local_218);
                                  if (sVar3 == 1) {
                                    this_00 = (pool_ref *)
                                              ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL>
                                              ::front((
                                                  ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL>
                                                  *)local_218);
                                    this_local = (StructuralParser *)
                                                 pool_ref::operator_cast_to_VariableDeclaration_
                                                           (this_00);
                                  }
                                  else {
                                    __begin4 = (pool_ref<soul::AST::VariableDeclaration> *)local_218
                                    ;
                                    __end4 = ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL>
                                             ::begin((
                                                  ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL>
                                                  *)__begin4);
                                    v = ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL>
                                        ::end((ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL>
                                               *)__begin4);
                                    for (; __end4 != v; __end4 = __end4 + 1) {
                                      local_268 = (pool_ref *)__end4;
                                      this_01 = getCurrentBlock(this);
                                      s = pool_ref::operator_cast_to_VariableDeclaration_(local_268)
                                      ;
                                      AST::Block::addStatement(this_01,&s->super_Statement);
                                    }
                                    this_local = (StructuralParser *)getNoop(this);
                                  }
                                  __range4._4_4_ = 1;
                                  ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL>
                                  ::~ArrayWithPreallocation
                                            ((ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL>
                                              *)local_218);
                                  AST::Context::~Context((Context *)(variablesCreated.space + 7));
                                }
                                else {
                                  __range4._4_4_ = 0;
                                }
                                pool_ptr<soul::AST::Expression>::~pool_ptr
                                          ((pool_ptr<soul::AST::Expression> *)local_160);
                                if (__range4._4_4_ == 0) {
                                  UTF8Reader::UTF8Reader(&local_270,(UTF8Reader *)&type);
                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                  ::resetPosition(&this->super_SOULTokeniser,&local_270);
                                  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                          ::matches(&this->super_SOULTokeniser,
                                                    (TokenType)"$identifier");
                                  if (!bVar1) {
                                    giveErrorOnExternalKeyword(this);
                                    giveErrorOnAssignmentToProcessorProperty(this);
                                  }
                                  this_local = (StructuralParser *)
                                               parseExpressionAsStatement(this,true);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (Statement *)this_local;
}

Assistant:

AST::Statement& parseStatement()
    {
        if (matches (Operator::openBrace))     return parseBracedBlock ({});
        if (matchIf (Keyword::if_))            return parseIf();
        if (matchIf (Keyword::while_))         return parseWhileLoop();
        if (matchIf (Keyword::for_))           return parseForLoop();
        if (matchIf (Keyword::loop))           return parseLoopStatement();
        if (matchIf (Keyword::return_))        return parseReturn();
        if (matchIf (Keyword::break_))         return matchEndOfStatement (allocate<AST::BreakStatement> (getContext()));
        if (matchIf (Keyword::continue_))      return matchEndOfStatement (allocate<AST::ContinueStatement> (getContext()));
        if (matchIf (Keyword::let))            return parseLocalLetOrVar (true);
        if (matchIf (Keyword::var))            return parseLocalLetOrVar (false);
        if (matches (Keyword::external))       throwError (Errors::externalNotAllowedInFunction());
        if (matchIf (Operator::semicolon))     return getNoop();
        if (matchIf (Operator::plusplus))      return matchEndOfStatement (parsePreIncDec (true));
        if (matchIf (Operator::minusminus))    return matchEndOfStatement (parsePreIncDec (false));
        if (matches (Operator::openParen))     return matchEndOfStatement (parseFactor());

        if (matchesAny (Token::literalInt32, Token::literalInt64, Token::literalFloat64,
                        Token::literalFloat32, Token::literalString, Operator::minus,
                        Token::literalImag32, Token::literalImag64))
            return parseExpressionAsStatement (false);

        {
            auto oldPos = getCurrentTokeniserPosition();

            if (auto type = tryParsingType (ParseTypeContext::variableType))
            {
                if (matches (Token::identifier))
                {
                    if (matches (Operator::openParen))
                        throwError (Errors::expectedVariableDecl());

                    auto context = getContext();
                    ArrayWithPreallocation<pool_ref<AST::VariableDeclaration>, 8> variablesCreated;

                    parseVariableDeclaration (*type, parseIdentifier(), false, context,
                                              [&] (AST::VariableDeclaration& v) { variablesCreated.push_back (v); });

                    if (variablesCreated.size() == 1)
                        return variablesCreated.front();

                    for (auto& v : variablesCreated)
                        getCurrentBlock().addStatement (v);

                    return getNoop();
                }
            }

            resetPosition (oldPos);
        }

        if (! matches (Token::identifier))
        {
            giveErrorOnExternalKeyword();
            giveErrorOnAssignmentToProcessorProperty();
        }

        return parseExpressionAsStatement (true);
    }